

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFrames.c
# Opt level: O3

Gia_Man_t * Gia_ManFramesInit(Gia_Man_t *pAig,Gia_ParFra_t *pPars)

{
  Vec_Ptr_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *pVVar3;
  char *pcVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  undefined8 uVar10;
  int iVar11;
  uint uVar12;
  Gia_ManFra_t *p;
  Gia_Man_t *p_00;
  size_t sVar13;
  char *pcVar14;
  Gia_Obj_t *pGVar15;
  ulong uVar16;
  Gia_Man_t *pGVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  Vec_Int_t *pVVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  
  p = (Gia_ManFra_t *)calloc(1,0x28);
  p->pAig = pAig;
  p->pPars = pPars;
  Gia_ManFraSupports(p);
  pVVar1 = p->vIns;
  iVar24 = 0;
  iVar11 = 0;
  if (0 < (long)pVVar1->nSize) {
    lVar23 = 0;
    iVar11 = 0;
    do {
      iVar11 = iVar11 + *(int *)((long)pVVar1->pArray[lVar23] + 4);
      lVar23 = lVar23 + 1;
    } while (pVVar1->nSize != lVar23);
  }
  pVVar2 = p->vAnds;
  if (0 < (long)pVVar2->nSize) {
    lVar23 = 0;
    iVar24 = 0;
    do {
      iVar24 = iVar24 + *(int *)((long)pVVar2->pArray[lVar23] + 4);
      lVar23 = lVar23 + 1;
    } while (pVVar2->nSize != lVar23);
  }
  pVVar3 = p->vOuts;
  if ((long)pVVar3->nSize < 1) {
    iVar18 = 0;
  }
  else {
    lVar23 = 0;
    iVar18 = 0;
    do {
      iVar18 = iVar18 + *(int *)((long)pVVar3->pArray[lVar23] + 4);
      lVar23 = lVar23 + 1;
    } while (pVVar3->nSize != lVar23);
  }
  p_00 = Gia_ManStart(iVar24 + iVar11 + iVar18);
  pcVar4 = pAig->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar13 = strlen(pcVar4);
    pcVar14 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar14,pcVar4);
  }
  p_00->pName = pcVar14;
  pcVar4 = pAig->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar14 = (char *)0x0;
  }
  else {
    sVar13 = strlen(pcVar4);
    pcVar14 = (char *)malloc(sVar13 + 1);
    strcpy(pcVar14,pcVar4);
  }
  p_00->pSpec = pcVar14;
  Gia_ManHashAlloc(p_00);
  pAig->pObjs->Value = 0;
  if (0 < pPars->nFrames) {
    uVar22 = 0;
    do {
      if ((((long)pVVar1->nSize <= (long)uVar22) || ((long)pVVar2->nSize <= (long)uVar22)) ||
         ((long)pVVar3->nSize <= (long)uVar22)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar5 = pVVar1->pArray[uVar22];
      pvVar6 = pVVar2->pArray[uVar22];
      pvVar7 = pVVar3->pArray[uVar22];
      if (pPars->fVerbose != 0) {
        printf("Frame %3d : CI = %6d. AND = %6d. CO = %6d.\n",uVar22 & 0xffffffff,
               (ulong)*(uint *)((long)pvVar5 + 4),(ulong)*(uint *)((long)pvVar6 + 4),
               (ulong)*(uint *)((long)pvVar7 + 4));
      }
      pVVar21 = pAig->vCis;
      uVar19 = pVVar21->nSize;
      uVar20 = (ulong)uVar19;
      uVar12 = uVar19 - pAig->nRegs;
      uVar16 = (ulong)uVar12;
      if (uVar12 != 0 && pAig->nRegs <= (int)uVar19) {
        lVar23 = 0;
        do {
          uVar19 = (uint)uVar20;
          if ((int)uVar19 <= lVar23) goto LAB_0074ab7c;
          iVar11 = pVVar21->pArray[lVar23];
          if (((long)iVar11 < 0) || (pAig->nObjs <= iVar11)) goto LAB_0074ab1f;
          pGVar8 = pAig->pObjs;
          if (pGVar8 == (Gia_Obj_t *)0x0) break;
          pGVar15 = Gia_ManAppendObj(p_00);
          uVar16 = *(ulong *)pGVar15;
          *(ulong *)pGVar15 = uVar16 | 0x9fffffff;
          *(ulong *)pGVar15 =
               uVar16 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar9 = p_00->pObjs;
          if ((pGVar15 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar15)) {
LAB_0074ab3e:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar15 - (long)pGVar9) >> 2) * -0x55555555);
          pGVar9 = p_00->pObjs;
          if ((pGVar15 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar15)) goto LAB_0074ab3e;
          pGVar8[iVar11].Value = (int)((ulong)((long)pGVar15 - (long)pGVar9) >> 2) * 0x55555556;
          lVar23 = lVar23 + 1;
          pVVar21 = pAig->vCis;
          uVar19 = pVVar21->nSize;
          uVar20 = (ulong)(int)uVar19;
          uVar16 = uVar20 - (long)pAig->nRegs;
        } while (lVar23 < (long)uVar16);
      }
      uVar12 = *(uint *)((long)pvVar5 + 4);
      if (uVar22 == 0) {
        if (0 < (int)uVar12) {
          lVar23 = *(long *)((long)pvVar5 + 8);
          uVar20 = 0;
          do {
            iVar11 = *(int *)(lVar23 + uVar20 * 4);
            if (((long)iVar11 < 0) || (pAig->nObjs <= iVar11)) goto LAB_0074ab1f;
            if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
            pGVar8 = pAig->pObjs + iVar11;
            uVar10 = *(undefined8 *)pGVar8;
            if (((uint)uVar10 & 0x9fffffff) != 0x9fffffff) {
              __assert_fail("Gia_ObjIsCi(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                            ,0x2f7,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
            }
            if ((int)uVar16 <= (int)((uint)((ulong)uVar10 >> 0x20) & 0x1fffffff)) {
              pGVar8->Value = 0;
            }
            uVar20 = uVar20 + 1;
          } while (uVar12 != uVar20);
        }
      }
      else if (0 < (int)uVar12) {
        lVar23 = *(long *)((long)pvVar5 + 8);
        uVar20 = 0;
        do {
          iVar11 = *(int *)(lVar23 + uVar20 * 4);
          if (((long)iVar11 < 0) || (pAig->nObjs <= iVar11)) goto LAB_0074ab1f;
          pGVar8 = pAig->pObjs;
          if (pGVar8 == (Gia_Obj_t *)0x0) break;
          uVar10 = *(undefined8 *)(pGVar8 + iVar11);
          if (((uint)uVar10 & 0x9fffffff) != 0x9fffffff) {
            __assert_fail("Gia_ObjIsCi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                          ,0x300,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
          }
          uVar25 = (uint)((ulong)uVar10 >> 0x20) & 0x1fffffff;
          if ((int)uVar16 <= (int)uVar25) {
            iVar24 = pAig->vCos->nSize;
            uVar25 = (iVar24 - uVar19) + uVar25;
            if (((int)uVar25 < 0) || (iVar24 <= (int)uVar25)) {
LAB_0074ab7c:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar25 = pAig->vCos->pArray[uVar25];
            if (((long)(int)uVar25 < 0) || ((uint)pAig->nObjs <= uVar25)) goto LAB_0074ab1f;
            pGVar8[iVar11].Value = pGVar8[(int)uVar25].Value;
          }
          uVar20 = uVar20 + 1;
        } while (uVar12 != uVar20);
      }
      if (0 < *(int *)((long)pvVar6 + 4)) {
        lVar23 = 0;
        do {
          iVar11 = *(int *)(*(long *)((long)pvVar6 + 8) + lVar23 * 4);
          if (((long)iVar11 < 0) || (pAig->nObjs <= iVar11)) goto LAB_0074ab1f;
          if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar8 = pAig->pObjs + iVar11;
          uVar16 = *(ulong *)pGVar8;
          if (((int)(uint)uVar16 < 0) || (uVar19 = (uint)uVar16 & 0x1fffffff, uVar19 == 0x1fffffff))
          {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                          ,0x321,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
          }
          if ((int)pGVar8[-(ulong)uVar19].Value < 0) goto LAB_0074ab5d;
          uVar12 = (uint)(uVar16 >> 0x20);
          if ((int)pGVar8[-(ulong)(uVar12 & 0x1fffffff)].Value < 0) goto LAB_0074ab5d;
          uVar19 = Gia_ManHashAnd(p_00,pGVar8[-(ulong)uVar19].Value ^ (uint)(uVar16 >> 0x1d) & 1,
                                  pGVar8[-(ulong)(uVar12 & 0x1fffffff)].Value ^ uVar12 >> 0x1d & 1);
          pGVar8->Value = uVar19;
          lVar23 = lVar23 + 1;
        } while (lVar23 < *(int *)((long)pvVar6 + 4));
      }
      iVar11 = *(int *)((long)pvVar7 + 4);
      if (0 < iVar11) {
        lVar23 = 0;
        do {
          iVar24 = *(int *)(*(long *)((long)pvVar7 + 8) + lVar23 * 4);
          if (((long)iVar24 < 0) || (pAig->nObjs <= iVar24)) {
LAB_0074ab1f:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar8 = pAig->pObjs + iVar24;
          uVar19 = (uint)*(undefined8 *)pGVar8;
          if ((-1 < (int)uVar19) || ((uVar19 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFrames.c"
                          ,0x326,"Gia_Man_t *Gia_ManFramesInit(Gia_Man_t *, Gia_ParFra_t *)");
          }
          uVar12 = pGVar8[-(ulong)(uVar19 & 0x1fffffff)].Value;
          if ((int)((uint)((ulong)*(undefined8 *)pGVar8 >> 0x20) & 0x1fffffff) <
              pAig->vCos->nSize - pAig->nRegs) {
            if ((int)uVar12 < 0) goto LAB_0074ab5d;
            uVar19 = Gia_ManAppendCo(p_00,uVar12 ^ uVar19 >> 0x1d & 1);
            pGVar8->Value = uVar19;
            iVar11 = *(int *)((long)pvVar7 + 4);
          }
          else {
            if ((int)uVar12 < 0) {
LAB_0074ab5d:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            pGVar8->Value = uVar12 ^ uVar19 >> 0x1d & 1;
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < iVar11);
      }
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < (long)pPars->nFrames);
  }
  Gia_ManFraStop(p);
  Gia_ManHashStop(p_00);
  iVar11 = Gia_ManCombMarkUsed(p_00);
  uVar19 = ~(p_00->vCos->nSize + p_00->vCis->nSize) + p_00->nObjs;
  if (iVar11 < (int)uVar19) {
    pGVar17 = Gia_ManDupMarked(p_00);
    if (pPars->fVerbose != 0) {
      printf("Before cleanup = %d nodes. After cleanup = %d nodes.\n",
             (ulong)(uint)(~(p_00->vCos->nSize + p_00->vCis->nSize) + p_00->nObjs),
             (ulong)(uint)(~(pGVar17->vCos->nSize + pGVar17->vCis->nSize) + pGVar17->nObjs));
    }
    Gia_ManStop(p_00);
    p_00 = pGVar17;
  }
  else if (pPars->fVerbose != 0) {
    printf("Before cleanup = %d nodes. After cleanup = %d nodes.\n",(ulong)uVar19);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManFramesInit( Gia_Man_t * pAig, Gia_ParFra_t * pPars )
{
    int fUseAllPis = 1;
    Gia_Man_t * pFrames, * pTemp;
    Gia_ManFra_t * p;
    Gia_Obj_t * pObj;
    Vec_Int_t * vIns, * vAnds, * vOuts;
    int i, f;
    p = Gia_ManFraStart( pAig, pPars );
    Gia_ManFraSupports( p );
    pFrames = Gia_ManStart( Vec_VecSizeSize((Vec_Vec_t*)p->vIns)+
        Vec_VecSizeSize((Vec_Vec_t*)p->vAnds)+Vec_VecSizeSize((Vec_Vec_t*)p->vOuts) );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    Gia_ManHashAlloc( pFrames );
    Gia_ManConst0(pAig)->Value = 0;
    for ( f = 0; f < pPars->nFrames; f++ )
    {
        vIns  = (Vec_Int_t *)Vec_PtrEntry( p->vIns,  f );
        vAnds = (Vec_Int_t *)Vec_PtrEntry( p->vAnds, f );
        vOuts = (Vec_Int_t *)Vec_PtrEntry( p->vOuts, f );
        if ( pPars->fVerbose )
            printf( "Frame %3d : CI = %6d. AND = %6d. CO = %6d.\n", 
            f, Vec_IntSize(vIns), Vec_IntSize(vAnds), Vec_IntSize(vOuts) );
        if ( fUseAllPis )
        {
            Gia_ManForEachPi( pAig, pObj, i )
                pObj->Value = Gia_ManAppendCi( pFrames );
            if ( f == 0 )
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( !Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = 0;
                }
            }
            else
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( !Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = Gia_ObjRoToRi(pAig, pObj)->Value;
                }
            }
        }
        else
        {
            if ( f == 0 )
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = Gia_ManAppendCi( pFrames );
                    else
                        pObj->Value = 0;
                }
            }
            else
            {
                Gia_ManForEachObjVec( vIns, pAig, pObj, i )
                {
                    assert( Gia_ObjIsCi(pObj) );
                    if ( Gia_ObjIsPi(pAig, pObj) )
                        pObj->Value = Gia_ManAppendCi( pFrames );
                    else
                        pObj->Value = Gia_ObjRoToRi(pAig, pObj)->Value;
                }
            }
        }
        Gia_ManForEachObjVec( vAnds, pAig, pObj, i )
        {
            assert( Gia_ObjIsAnd(pObj) );
            pObj->Value = Gia_ManHashAnd( pFrames, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        Gia_ManForEachObjVec( vOuts, pAig, pObj, i )
        {
            assert( Gia_ObjIsCo(pObj) );
            if ( Gia_ObjIsPo(pAig, pObj) )
                pObj->Value = Gia_ManAppendCo( pFrames, Gia_ObjFanin0Copy(pObj) );
            else
                pObj->Value = Gia_ObjFanin0Copy(pObj);
        }
    }
    Gia_ManFraStop( p );
    Gia_ManHashStop( pFrames );
    if ( Gia_ManCombMarkUsed(pFrames) < Gia_ManAndNum(pFrames) )
    {
        pFrames = Gia_ManDupMarked( pTemp = pFrames );
        if ( pPars->fVerbose )
            printf( "Before cleanup = %d nodes. After cleanup = %d nodes.\n", 
                Gia_ManAndNum(pTemp), Gia_ManAndNum(pFrames) );
        Gia_ManStop( pTemp );
    }
    else if ( pPars->fVerbose )
            printf( "Before cleanup = %d nodes. After cleanup = %d nodes.\n", 
                Gia_ManAndNum(pFrames), Gia_ManAndNum(pFrames) );
    return pFrames;
}